

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

float deqp::gles31::Functional::makeFloatRepresentable(float f,Precision precision)

{
  int iVar1;
  int exponent;
  StorageType_conflict SVar2;
  byte bVar3;
  size_t *siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  float local_48;
  float local_44;
  Float<unsigned_int,_8,_23,_127,_3U> local_40;
  Float<unsigned_int,_8,_23,_127,_3U> local_3c;
  Float32 targetRepresentation;
  Float32 float32Representation;
  float zeroValue;
  float fStack_28;
  bool zeroNotRepresentable;
  uint local_24;
  float largestRepresentableValue;
  deUint32 representableMantissaMask;
  int minNormalizedValueExponent;
  int maxNormalizedValueExponent;
  int numMantissaBits;
  Precision precision_local;
  float f_local;
  
  precision_local = (Precision)f;
  if (precision != PRECISION_HIGHP) {
    maxNormalizedValueExponent = precision;
    numMantissaBits = (int)f;
    minNormalizedValueExponent = getMinMantissaBits(precision);
    representableMantissaMask = getMaxNormalizedValueExponent(maxNormalizedValueExponent);
    largestRepresentableValue = (float)getMinNormalizedValueExponent(maxNormalizedValueExponent);
    bVar3 = (byte)minNormalizedValueExponent;
    local_24 = (1 << (bVar3 & 0x1f)) + -1 << (0x17 - bVar3 & 0x1f);
    ctx = (EVP_PKEY_CTX *)(ulong)representableMantissaMask;
    siglen = (size_t *)(ulong)(0x17U - minNormalizedValueExponent);
    zeroValue = (float)tcu::Float<unsigned_int,_8,_23,_127,_3U>::constructBits
                                 (1,representableMantissaMask,
                                  (1 << (bVar3 & 0x1f)) + -1 <<
                                  ((byte)(0x17U - minNormalizedValueExponent) & 0x1f));
    fStack_28 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&zeroValue);
    if (maxNormalizedValueExponent == 0) {
      ctx = (EVP_PKEY_CTX *)(ulong)(uint)largestRepresentableValue;
      targetRepresentation.m_value =
           (StorageType_conflict)
           tcu::Float<unsigned_int,_8,_23,_127,_3U>::constructBits
                     (1,(int)largestRepresentableValue,1);
      local_44 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&targetRepresentation);
    }
    else {
      local_44 = 0.0;
    }
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_3c,(float)numMantissaBits);
    iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_3c);
    if (iVar1 < (int)largestRepresentableValue) {
      precision_local = (Precision)local_44;
    }
    else {
      iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_3c);
      if ((int)representableMantissaMask < iVar1) {
        iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_3c,ctx,sig,siglen,in_R8,in_R9)
        ;
        if (iVar1 == 1) {
          local_48 = fStack_28;
        }
        else {
          local_48 = -fStack_28;
        }
        precision_local = (Precision)local_48;
      }
      else {
        iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_3c,ctx,sig,siglen,in_R8,in_R9)
        ;
        exponent = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_3c);
        SVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissaBits(&local_3c);
        local_40 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::constructBits
                             (iVar1,exponent,SVar2 & local_24);
        precision_local = (Precision)tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_40);
      }
    }
  }
  return (float)precision_local;
}

Assistant:

static float makeFloatRepresentable (float f, glu::Precision precision)
{
	if (precision == glu::PRECISION_HIGHP)
	{
		// \note: assuming f is not extended-precision
		return f;
	}
	else
	{
		const int			numMantissaBits				= getMinMantissaBits(precision);
		const int			maxNormalizedValueExponent	= getMaxNormalizedValueExponent(precision);
		const int			minNormalizedValueExponent	= getMinNormalizedValueExponent(precision);
		const deUint32		representableMantissaMask	= ((deUint32(1) << numMantissaBits) - 1) << (23 - (deUint32)numMantissaBits);
		const float			largestRepresentableValue	= tcu::Float32::constructBits(+1, maxNormalizedValueExponent, ((1u << numMantissaBits) - 1u) << (23u - (deUint32)numMantissaBits)).asFloat();
		const bool			zeroNotRepresentable		= (precision == glu::PRECISION_LOWP);

		// if zero is not required to be representable, use smallest positive non-subnormal value
		const float			zeroValue					= (zeroNotRepresentable) ? (tcu::Float32::constructBits(+1, minNormalizedValueExponent, 1).asFloat()) : (0.0f);

		const tcu::Float32	float32Representation		(f);

		if (float32Representation.exponent() < minNormalizedValueExponent)
		{
			// flush too small values to zero
			return zeroValue;
		}
		else if (float32Representation.exponent() > maxNormalizedValueExponent)
		{
			// clamp too large values
			return (float32Representation.sign() == +1) ? (largestRepresentableValue) : (-largestRepresentableValue);
		}
		else
		{
			// remove unrepresentable mantissa bits
			const tcu::Float32 targetRepresentation(tcu::Float32::constructBits(float32Representation.sign(),
													float32Representation.exponent(),
													float32Representation.mantissaBits() & representableMantissaMask));

			return targetRepresentation.asFloat();
		}
	}
}